

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O2

CURLcode Curl_dynhds_h1_add_line(dynhds *dynhds,char *line,size_t line_len)

{
  dynhds_entry *pdVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  CURLcode CVar5;
  void *pvVar6;
  void *pvVar7;
  dynhds_entry *pdVar8;
  char *value;
  char *pcVar9;
  long lVar10;
  char *__n;
  
  CVar5 = CURLE_OK;
  if (line_len != 0 && line != (char *)0x0) {
    if ((*line == ' ') || (*line == '\t')) {
      if (dynhds->hds_len != 0) {
        for (lVar10 = -line_len; lVar10 != 0; lVar10 = lVar10 + 1) {
          if ((*line != ' ') && (*line != '\t')) {
            pdVar1 = dynhds->hds[dynhds->hds_len - 1];
            sVar2 = pdVar1->valuelen;
            pdVar8 = (dynhds_entry *)(*Curl_ccalloc)(1,((pdVar1->namelen + sVar2) - lVar10) + 0x23);
            if (pdVar8 == (dynhds_entry *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            pdVar8->name = (char *)(pdVar8 + 1);
            memcpy(pdVar8 + 1,pdVar1->name,pdVar1->namelen);
            sVar3 = pdVar1->namelen;
            pdVar8->namelen = sVar3;
            pcVar9 = (char *)((long)&pdVar8[1].name + sVar3 + 1);
            pdVar8->value = pcVar9;
            memcpy(pcVar9,pdVar1->value,pdVar1->valuelen);
            sVar4 = pdVar1->valuelen;
            *(undefined1 *)((long)&pdVar8[1].name + sVar4 + sVar3 + 1) = 0x20;
            memcpy((void *)((long)&pdVar8[1].name + sVar4 + sVar3 + 2),line,-lVar10);
            pdVar8->valuelen = (sVar2 - lVar10) + 1;
            dynhds->hds[dynhds->hds_len - 1] = pdVar8;
            (*Curl_cfree)(pdVar1);
            return CURLE_OK;
          }
          line = line + 1;
        }
      }
      CVar5 = CURLE_BAD_FUNCTION_ARGUMENT;
    }
    else {
      pvVar6 = memchr(line,0x3a,line_len);
      if (pvVar6 != (void *)0x0) {
        value = (char *)((long)pvVar6 + 1);
        pcVar9 = value;
        for (; ((ulong)((long)pcVar9 - (long)line) < line_len &&
               ((*value == ' ' || (*value == '\t')))); value = value + 1) {
          pcVar9 = pcVar9 + 1;
        }
        __n = line + (line_len - (long)pcVar9);
        pvVar7 = memchr(value,0xd,(size_t)__n);
        if (pvVar7 == (void *)0x0) {
          pvVar7 = memchr(value,10,(size_t)__n);
        }
        pcVar9 = (char *)((long)pvVar7 - (long)pcVar9);
        if (pvVar7 == (void *)0x0) {
          pcVar9 = __n;
        }
        CVar5 = Curl_dynhds_add(dynhds,line,(long)pvVar6 - (long)line,value,(size_t)pcVar9);
        return CVar5;
      }
      CVar5 = CURLE_BAD_FUNCTION_ARGUMENT;
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_dynhds_h1_add_line(struct dynhds *dynhds,
                                 const char *line, size_t line_len)
{
  const char *p;
  const char *name;
  size_t namelen;
  const char *value;
  size_t valuelen, i;

  if(!line || !line_len)
    return CURLE_OK;

  if((line[0] == ' ') || (line[0] == '\t')) {
    struct dynhds_entry *e, *e2;
    /* header continuation, yikes! */
    if(!dynhds->hds_len)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    while(line_len && ISBLANK(line[0])) {
      ++line;
      --line_len;
    }
    if(!line_len)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    e = dynhds->hds[dynhds->hds_len-1];
    e2 = entry_append(e, line, line_len);
    if(!e2)
      return CURLE_OUT_OF_MEMORY;
    dynhds->hds[dynhds->hds_len-1] = e2;
    entry_free(e);
    return CURLE_OK;
  }
  else {
    p = memchr(line, ':', line_len);
    if(!p)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    name = line;
    namelen = p - line;
    p++; /* move past the colon */
    for(i = namelen + 1; i < line_len; ++i, ++p) {
      if(!ISBLANK(*p))
        break;
    }
    value = p;
    valuelen = line_len - i;

    p = memchr(value, '\r', valuelen);
    if(!p)
      p = memchr(value, '\n', valuelen);
    if(p)
      valuelen = (size_t)(p - value);

    return Curl_dynhds_add(dynhds, name, namelen, value, valuelen);
  }
}